

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::assert_range_equals_msg(void)

{
  initializer_list<int> __l;
  initializer_list<long> __l_00;
  allocator local_f9;
  string expected;
  Assert local_d0;
  vector<int,_std::allocator<int>_> v;
  deque<long,_std::allocator<long>_> li;
  
  li.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x100000000;
  li.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_map_size =
       0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&li;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&expected);
  expected.field_2._M_allocated_capacity = 2;
  expected.field_2._8_8_ = 3;
  expected._M_dataplus._M_p = (pointer)0x0;
  expected._M_string_length = 3;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&expected;
  std::deque<long,_std::allocator<long>_>::deque(&li,__l_00,(allocator_type *)&local_d0);
  local_d0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_d0.m_line = 0x18d;
  std::__cxx11::string::string((string *)&expected,"Message.",&local_f9);
  UnitTests::Assert::
  RangeEquals<std::deque<long,std::allocator<long>>,std::vector<int,std::allocator<int>>>
            (&local_d0,&expected,&li,&v);
  std::__cxx11::string::~string((string *)&expected);
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base
            (&li.super__Deque_base<long,_std::allocator<long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(assert_range_equals_msg)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::deque<long> li{0, 3, 2, 3};
            ASSERT_RANGE_EQUALS("Message.", li, v);
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();

            std::string expected =
                "error A1000: Assertion failure : Message. Expected range [4] different to actual range [4]\n"
                "\telement[0] = (0,0)\n"
                "\telement[1] = (3,1) <--------- HERE\n"
                "\telement[2] = (2,2)\n"
                "\telement[3] = (3,3)\n";

            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_RANGE_EQUALS", __FILE__, __LINE__);
            }
        }
    }